

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_HashPLTerm_Test::TestBody(ExprTest_HashPLTerm_Test *this)

{
  Reference other;
  PLTerm other_00;
  undefined1 uVar1;
  hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *in_RDI;
  AssertionResult gtest_ar;
  Reference var;
  size_t i;
  double slopes [3];
  double breakpoints [2];
  size_t hash;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffff08;
  AssertHelper *this_00;
  double *in_stack_ffffffffffffff18;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *this_01;
  uint in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar2;
  AssertionResult *this_02;
  int line;
  undefined7 in_stack_ffffffffffffff30;
  Type type;
  ExprBase in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  ExprTest *in_stack_ffffffffffffff50;
  ExprBase in_stack_ffffffffffffff58;
  Message *in_stack_ffffffffffffff88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff90;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> local_60;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  AssertHelper *local_10;
  
  local_14 = 0x28;
  local_10 = (AssertHelper *)
             mp::internal::HashCombine<int>
                       (CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (int *)in_stack_ffffffffffffff18);
  local_28 = 0x4014000000000000;
  local_20 = 0x4024000000000000;
  local_48 = 0xbff0000000000000;
  local_40 = 0;
  local_38 = 0x3ff0000000000000;
  for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
    local_10 = (AssertHelper *)
               mp::internal::HashCombine<double>
                         (CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
    local_10 = (AssertHelper *)
               mp::internal::HashCombine<double>
                         (CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
  }
  local_10 = (AssertHelper *)
             mp::internal::HashCombine<double>
                       (CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
  local_58.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(in_stack_ffffffffffffff08,0);
  this_01 = &local_60;
  uVar2 = 0;
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ = 0;
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_ffffffffffffff20;
  this_00 = local_10;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            (this_01,other,(type_conflict)((ulong)local_10 >> 0x20));
  local_10 = (AssertHelper *)
             mp::internal::HashCombine<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                       (CONCAT44(uVar2,in_stack_ffffffffffffff20),this_01);
  ExprTest::MakePLTerm
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             (double *)in_stack_ffffffffffffff40.impl_,(double *)in_RDI,
             (Reference)in_stack_ffffffffffffff58.impl_);
  other_00.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._4_4_ =
       uVar2;
  other_00.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_._0_4_ =
       in_stack_ffffffffffffff20;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::PLTerm>
            (this_01,other_00,(type_conflict)((ulong)this_00 >> 0x20));
  std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
            (in_RDI,(Expr)in_stack_ffffffffffffff40.impl_);
  type = (Type)((ulong)in_RDI >> 0x20);
  this_02 = (AssertionResult *)&stack0xffffffffffffff88;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)this_02,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff20),
             (unsigned_long *)this_01,(unsigned_long *)this_00);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  line = (int)((ulong)this_02 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40.impl_);
    testing::AssertionResult::failure_message((AssertionResult *)0x13f0e1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff40.impl_,type,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff30),line,
               (char *)CONCAT44(uVar2,in_stack_ffffffffffffff20));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff90.ptr_,in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x13f12d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f170);
  return;
}

Assistant:

TEST_F(ExprTest, HashPLTerm) {
  size_t hash = HashCombine<int>(0, expr::PLTERM);
  enum {NUM_BREAKPOINTS = 2};
  double breakpoints[NUM_BREAKPOINTS] = {5, 10};
  double slopes[NUM_BREAKPOINTS + 1] = {-1, 0, 1};
  for (size_t i = 0; i < NUM_BREAKPOINTS; ++i) {
    hash = HashCombine(hash, slopes[i]);
    hash = HashCombine(hash, breakpoints[i]);
  }
  hash = HashCombine(hash, slopes[NUM_BREAKPOINTS]);
  auto var = factory_.MakeVariable(9);
  hash = HashCombine<Expr>(hash, var);
  EXPECT_EQ(hash, ExprHash()(
    MakePLTerm(NUM_BREAKPOINTS, breakpoints, slopes, var)));
}